

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

Aig_Man_t * Rtm_ManToAig(Rtm_Man_t *pRtm)

{
  int iVar1;
  Rtm_Init_t RVar2;
  int *pLatches_00;
  Rtm_Obj_t *pRVar3;
  Aig_Man_t *p;
  undefined8 *puVar4;
  Aig_Obj_t *pAVar5;
  Rtm_Edg_t *pRVar6;
  Rtm_Obj_t *pRVar7;
  int *pLatches;
  int nLatches;
  int Val;
  int m;
  int k;
  int i;
  Rtm_Edg_t *pEdge;
  Rtm_Obj_t *pObjRtm;
  Aig_Obj_t *pObjNew;
  Aig_Man_t *pNew;
  Rtm_Man_t *pRtm_local;
  
  iVar1 = Vec_PtrSize(pRtm->vObjs);
  pLatches_00 = (int *)malloc((long)(iVar1 << 1) << 2);
  pLatches._4_4_ = 0;
  for (m = 0; iVar1 = Vec_PtrSize(pRtm->vObjs), m < iVar1; m = m + 1) {
    pRVar3 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,m);
    for (Val = 0; Val < (int)(*(uint *)&pRVar3->field_0x8 >> 7 & 0xff); Val = Val + 1) {
      pRVar6 = Rtm_ObjEdge(pRVar3,Val);
      iVar1 = Vec_PtrSize(pRtm->vPis);
      pLatches_00[pRVar3->Id * 2 + Val] = iVar1 + pLatches._4_4_;
      pLatches._4_4_ = (*(uint *)pRVar6 & 0xfff) + pLatches._4_4_;
    }
  }
  iVar1 = Vec_PtrSize(pRtm->vObjs);
  p = Aig_ManStart(iVar1 + pLatches._4_4_);
  puVar4 = (undefined8 *)Vec_PtrEntry(pRtm->vObjs,0);
  pAVar5 = Aig_ManConst1(p);
  *puVar4 = pAVar5;
  for (m = 0; iVar1 = Vec_PtrSize(pRtm->vPis), m < iVar1; m = m + 1) {
    puVar4 = (undefined8 *)Vec_PtrEntry(pRtm->vPis,m);
    pAVar5 = Aig_ObjCreateCi(p);
    *puVar4 = pAVar5;
  }
  for (m = 0; m < pLatches._4_4_; m = m + 1) {
    Aig_ObjCreateCi(p);
  }
  for (m = 0; iVar1 = Vec_PtrSize(pRtm->vObjs), m < iVar1; m = m + 1) {
    pRVar3 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,m);
    Rtm_ManToAig_rec(p,pRtm,pRVar3,pLatches_00);
  }
  for (m = 0; iVar1 = Vec_PtrSize(pRtm->vPos), m < iVar1; m = m + 1) {
    puVar4 = (undefined8 *)Vec_PtrEntry(pRtm->vPos,m);
    Aig_ObjCreateCo(p,(Aig_Obj_t *)*puVar4);
  }
  m = 0;
  do {
    iVar1 = Vec_PtrSize(pRtm->vObjs);
    if (iVar1 <= m) {
      if (pLatches_00 != (int *)0x0) {
        free(pLatches_00);
      }
      Aig_ManSetRegNum(p,pLatches._4_4_);
      Aig_ManCleanup(p);
      iVar1 = Aig_ManCheck(p);
      if (iVar1 == 0) {
        printf("Rtm_ManToAig: The network check has failed.\n");
      }
      return p;
    }
    pRVar3 = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,m);
    for (Val = 0; Val < (int)(*(uint *)&pRVar3->field_0x8 >> 7 & 0xff); Val = Val + 1) {
      pRVar6 = Rtm_ObjEdge(pRVar3,Val);
      if (((ulong)*pRVar6 & 0xfff) != 0) {
        pRVar7 = Rtm_ObjFanin(pRVar3,Val);
        pObjRtm = (Rtm_Obj_t *)pRVar7->pCopy;
        for (nLatches = 0; nLatches < (int)(*(uint *)pRVar6 & 0xfff); nLatches = nLatches + 1) {
          RVar2 = Rtm_ObjGetOne(pRtm,pRVar6,((*(uint *)pRVar6 & 0xfff) - 1) - nLatches);
          if (((RVar2 != RTM_VAL_ZERO) && (RVar2 != RTM_VAL_ONE)) && (RVar2 != RTM_VAL_VOID)) {
            __assert_fail("Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                          ,0x326,"Aig_Man_t *Rtm_ManToAig(Rtm_Man_t *)");
          }
          pAVar5 = Aig_NotCond((Aig_Obj_t *)pObjRtm,(uint)(RVar2 == RTM_VAL_ONE));
          Aig_ObjCreateCo(p,pAVar5);
          pAVar5 = Aig_ManCi(p,pLatches_00[pRVar3->Id * 2 + Val] + nLatches);
          pObjRtm = (Rtm_Obj_t *)Aig_NotCond(pAVar5,(uint)(RVar2 == RTM_VAL_ONE));
        }
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Rtm_ManToAig( Rtm_Man_t * pRtm )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObjNew;
    Rtm_Obj_t * pObjRtm;
    Rtm_Edg_t * pEdge;
    int i, k, m, Val, nLatches, * pLatches;
    // count latches and mark the first latch on each edge
    pLatches = ABC_ALLOC( int, 2 * Vec_PtrSize(pRtm->vObjs) );
    nLatches = 0;
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        pLatches[2*pObjRtm->Id + k] = Vec_PtrSize(pRtm->vPis) + nLatches;
        nLatches += pEdge->nLats;
    }
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(pRtm->vObjs) + nLatches );
    // create PIs/POs and latches
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->pCopy = Aig_ManConst1(pNew);
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->pCopy = Aig_ObjCreateCi(pNew);
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCi(pNew);
    // create internal nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
        Rtm_ManToAig_rec( pNew, pRtm, pObjRtm, pLatches );
    // create POs
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObjRtm->pCopy );
    // connect latches 
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            continue;
        pObjNew = (Aig_Obj_t *)Rtm_ObjFanin( pObjRtm, k )->pCopy;
        for ( m = 0; m < (int)pEdge->nLats; m++ )
        {
            Val = Rtm_ObjGetOne( pRtm, pEdge, pEdge->nLats - 1 - m );
            assert( Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
            Aig_ObjCreateCo( pNew, pObjNew );
            pObjNew = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + m );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
        }
//        assert( Aig_Regular(pObjNew)->nRefs > 0 );
    }
    ABC_FREE( pLatches );
    Aig_ManSetRegNum( pNew, nLatches );
    // remove useless nodes
    Aig_ManCleanup( pNew );
    if ( !Aig_ManCheck( pNew ) )
        printf( "Rtm_ManToAig: The network check has failed.\n" );
    return pNew;
}